

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

optional<pbrt::SquareMatrix<3>_> *
pbrt::LinearLeastSquares<3>(Float (*A) [3],Float (*B) [3],int rows)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  float *pfVar4;
  optional<pbrt::SquareMatrix<3>_> *this;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  optional<pbrt::SquareMatrix<3>_> *in_RDI;
  optional<pbrt::SquareMatrix<3>_> AtAi;
  int r;
  int j;
  int i;
  SquareMatrix<3> AtB;
  SquareMatrix<3> AtA;
  SquareMatrix<3> *in_stack_00000278;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  SquareMatrix<3> *in_stack_fffffffffffffec0;
  SquareMatrix<3> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  SquareMatrix<3> *in_stack_ffffffffffffff40;
  optional local_b8 [40];
  span<float> local_90;
  span<float> local_80;
  int local_70;
  int local_6c;
  int local_68;
  int local_1c;
  long local_18;
  long local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  SquareMatrix<3>::Zero();
  SquareMatrix<3>::Zero();
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < local_1c; local_70 = local_70 + 1) {
        fVar1 = *(float *)(local_10 + (long)local_70 * 0xc + (long)local_68 * 4);
        fVar2 = *(float *)(local_10 + (long)local_70 * 0xc + (long)local_6c * 4);
        local_80 = SquareMatrix<3>::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        pfVar4 = pstd::span<float>::operator[](&local_80,(long)local_6c);
        *pfVar4 = fVar1 * fVar2 + *pfVar4;
        fVar1 = *(float *)(local_10 + (long)local_70 * 0xc + (long)local_68 * 4);
        fVar2 = *(float *)(local_18 + (long)local_70 * 0xc + (long)local_6c * 4);
        local_90 = SquareMatrix<3>::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        pfVar4 = pstd::span<float>::operator[](&local_90,(long)local_6c);
        *pfVar4 = fVar1 * fVar2 + *pfVar4;
      }
    }
  }
  Inverse<3>(in_stack_00000278);
  bVar3 = pstd::optional::operator_cast_to_bool(local_b8);
  if (bVar3) {
    this = (optional<pbrt::SquareMatrix<3>_> *)
           pstd::optional<pbrt::SquareMatrix<3>_>::operator*
                     ((optional<pbrt::SquareMatrix<3>_> *)0x89691a);
    operator*(in_stack_ffffffffffffff40,
              (SquareMatrix<3> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    Transpose<3>(in_stack_fffffffffffffef0);
    pstd::optional<pbrt::SquareMatrix<3>_>::optional
              (this,(SquareMatrix<3> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
              );
  }
  else {
    memset(in_RDI,0,0x28);
    pstd::optional<pbrt::SquareMatrix<3>_>::optional(in_RDI);
  }
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)0x896974);
  return in_RDI;
}

Assistant:

pstd::optional<SquareMatrix<N>> LinearLeastSquares(const Float A[][N], const Float B[][N],
                                                   int rows) {
    SquareMatrix<N> AtA = SquareMatrix<N>::Zero();
    SquareMatrix<N> AtB = SquareMatrix<N>::Zero();

    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            for (int r = 0; r < rows; ++r) {
                AtA[i][j] += A[r][i] * A[r][j];
                AtB[i][j] += A[r][i] * B[r][j];
            }

    auto AtAi = Inverse(AtA);
    if (!AtAi)
        return {};
    return Transpose(*AtAi * AtB);
}